

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult
          (BasicResult<Catch::clara::detail::ParseState> *this,Type type,string *message)

{
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type = type;
  (this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_00199468;
  ::std::__cxx11::string::string((string *)&this->m_errorMessage,(string *)message);
  if ((this->super_ResultValueBase<Catch::clara::detail::ParseState>).super_ResultBase.m_type != Ok)
  {
    return;
  }
  __assert_fail("m_type != ResultBase::Ok",
                "/workspace/llm4binary/github/license_c_cmakelists/Cycling74[P]min-api/test/catch.hpp"
                ,0x2340,
                "Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult(ResultBase::Type, const std::string &) [T = Catch::clara::detail::ParseState]"
               );
}

Assistant:

BasicResult( ResultBase::Type type, std::string const &message )
        :   ResultValueBase<T>(type),
            m_errorMessage(message)
        {
            assert( m_type != ResultBase::Ok );
        }